

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_isorr_bz2.c
# Opt level: O0

void test_read_format_isorr_bz2(void)

{
  int iVar1;
  archive_entry *a_00;
  char *pcVar2;
  char *unaff_retaddr;
  void *in_stack_00000008;
  wchar_t in_stack_00000014;
  char *in_stack_00000018;
  int i;
  int64_t offset;
  size_t size;
  void *p;
  archive *a;
  archive_entry *ae;
  char *refname;
  char *in_stack_000003c0;
  archive *in_stack_ffffffffffffffa8;
  archive *a_01;
  archive_entry **entry;
  archive_entry_conflict *paVar3;
  int64_t *piVar4;
  archive_entry *paVar5;
  archive *in_stack_ffffffffffffffb0;
  size_t *s;
  archive *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  wchar_t in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar6;
  wchar_t in_stack_ffffffffffffffd4;
  char *in_stack_ffffffffffffffd8;
  void *in_stack_ffffffffffffffe0;
  archive_entry *in_stack_fffffffffffffff0;
  char *_v2;
  
  _v2 = "test_read_format_iso_rockridge.iso.Z";
  extract_reference_file(in_stack_000003c0);
  a_00 = (archive_entry *)archive_read_new();
  assertion_assert((char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (wchar_t)((ulong)in_stack_ffffffffffffffb8 >> 0x20),
                   (wchar_t)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_ffffffffffffffa8);
  archive_read_support_filter_all(in_stack_ffffffffffffffa8);
  a_01 = (archive *)0x0;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x180f35,in_stack_ffffffffffffffe0
                     );
  archive_read_support_format_all(a_01);
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x180f6d,in_stack_ffffffffffffffe0
                     );
  archive_read_open_filename
            ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
             (char *)in_stack_ffffffffffffffb8,(size_t)in_stack_ffffffffffffffb0);
  entry = (archive_entry **)0x0;
  assertion_equal_int((char *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x180faf,in_stack_ffffffffffffffe0
                     );
  for (iVar6 = 0; iVar6 < 10; iVar6 = iVar6 + 1) {
    archive_read_next_header(in_stack_ffffffffffffffb0,entry);
    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                        (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                        (char *)0x180fff,in_stack_ffffffffffffffe0);
    archive_entry_is_encrypted(in_stack_fffffffffffffff0);
    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                        (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                        (char *)0x181038,in_stack_ffffffffffffffe0);
    archive_read_has_encrypted_entries(in_stack_ffffffffffffffb8);
    paVar5 = a_00;
    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                        (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                        (longlong)a_00,(char *)0x181074,in_stack_ffffffffffffffe0);
    pcVar2 = archive_entry_pathname(paVar5);
    iVar1 = strcmp(".",pcVar2);
    if (iVar1 == 0) {
      archive_entry_filetype(in_stack_fffffffffffffff0);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x1810d3,
                          in_stack_ffffffffffffffe0);
      archive_entry_size(in_stack_fffffffffffffff0);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x18110e,
                          in_stack_ffffffffffffffe0);
      archive_entry_mtime(in_stack_fffffffffffffff0);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x181149,
                          in_stack_ffffffffffffffe0);
      archive_entry_mtime_nsec(in_stack_fffffffffffffff0);
      paVar3 = (archive_entry_conflict *)0x0;
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x181181,
                          in_stack_ffffffffffffffe0);
      archive_entry_stat(paVar3);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x1811bd,
                          in_stack_ffffffffffffffe0);
      archive_entry_uid(in_stack_fffffffffffffff0);
      piVar4 = (int64_t *)0x0;
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x1811f8,
                          in_stack_ffffffffffffffe0);
      archive_read_data_block
                ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                 (void **)in_stack_ffffffffffffffb8,(size_t *)in_stack_ffffffffffffffb0,piVar4);
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,(longlong)a_00,(char *)0x181241,
                          in_stack_ffffffffffffffe0);
      entry = (archive_entry **)0x0;
      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                          in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x181275,
                          in_stack_ffffffffffffffe0);
    }
    else {
      pcVar2 = archive_entry_pathname(paVar5);
      iVar1 = strcmp("dir",pcVar2);
      if (iVar1 == 0) {
        archive_entry_pathname(paVar5);
        in_stack_ffffffffffffffb0 =
             (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
        assertion_equal_string
                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                   (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                   (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                   (char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                   in_stack_fffffffffffffff0,(wchar_t)_v2);
        archive_entry_filetype(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x181320,
                            in_stack_ffffffffffffffe0);
        archive_entry_size(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x18135b,
                            in_stack_ffffffffffffffe0);
        archive_entry_mtime(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x181396,
                            in_stack_ffffffffffffffe0);
        archive_entry_atime(in_stack_fffffffffffffff0);
        paVar3 = (archive_entry_conflict *)0x0;
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x1813d1,
                            in_stack_ffffffffffffffe0);
        archive_entry_stat(paVar3);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x18140d,
                            in_stack_ffffffffffffffe0);
        archive_entry_uid(in_stack_fffffffffffffff0);
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x181448,
                            in_stack_ffffffffffffffe0);
        archive_entry_gid(in_stack_fffffffffffffff0);
        entry = (archive_entry **)0x0;
        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x181483,
                            in_stack_ffffffffffffffe0);
      }
      else {
        pcVar2 = archive_entry_pathname(paVar5);
        iVar1 = strcmp("file",pcVar2);
        if (iVar1 == 0) {
          archive_entry_pathname(paVar5);
          s = (size_t *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
          assertion_equal_string
                    (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                     (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                     (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (char *)in_stack_ffffffffffffffb8,(char *)s,in_stack_fffffffffffffff0,
                     (wchar_t)_v2);
          archive_entry_filetype(in_stack_fffffffffffffff0);
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)s,0,(char *)0x18152e,in_stack_ffffffffffffffe0);
          archive_entry_size(in_stack_fffffffffffffff0);
          piVar4 = (int64_t *)0x0;
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)s,0,(char *)0x181569,in_stack_ffffffffffffffe0);
          archive_read_data_block
                    ((archive *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                     (void **)in_stack_ffffffffffffffb8,s,piVar4);
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)s,0,(char *)0x1815b0,in_stack_ffffffffffffffe0);
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)s,0,(char *)0x1815e0,in_stack_ffffffffffffffe0);
          in_stack_ffffffffffffffb0 = (archive *)0x2e6187;
          in_stack_ffffffffffffffb8 = (archive *)0x0;
          assertion_equal_mem(in_stack_00000018,in_stack_00000014,in_stack_00000008,unaff_retaddr,
                              _v2,(char *)in_stack_fffffffffffffff0,size,(char *)p,a);
          archive_entry_mtime(in_stack_fffffffffffffff0);
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)in_stack_ffffffffffffffb0,0,(char *)0x181666,
                              in_stack_ffffffffffffffe0);
          archive_entry_atime(in_stack_fffffffffffffff0);
          paVar3 = (archive_entry_conflict *)0x0;
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)in_stack_ffffffffffffffb0,0,(char *)0x1816a1,
                              in_stack_ffffffffffffffe0);
          archive_entry_stat(paVar3);
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)in_stack_ffffffffffffffb0,0,(char *)0x1816dd,
                              in_stack_ffffffffffffffe0);
          archive_entry_uid(in_stack_fffffffffffffff0);
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)in_stack_ffffffffffffffb0,0,(char *)0x181718,
                              in_stack_ffffffffffffffe0);
          archive_entry_gid(in_stack_fffffffffffffff0);
          entry = (archive_entry **)0x0;
          assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                              in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                              (char *)in_stack_ffffffffffffffb0,0,(char *)0x181753,
                              in_stack_ffffffffffffffe0);
        }
        else {
          pcVar2 = archive_entry_pathname(paVar5);
          iVar1 = strcmp("hardlink",pcVar2);
          if (iVar1 == 0) {
            archive_entry_pathname(paVar5);
            pcVar2 = (char *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
            assertion_equal_string
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                       (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (char *)in_stack_ffffffffffffffb8,pcVar2,in_stack_fffffffffffffff0,
                       (wchar_t)_v2);
            archive_entry_filetype(in_stack_fffffffffffffff0);
            paVar5 = (archive_entry *)0x0;
            assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,pcVar2
                                ,0,(char *)0x1817fe,in_stack_ffffffffffffffe0);
            archive_entry_hardlink(paVar5);
            in_stack_ffffffffffffffb0 = (archive *)((ulong)pcVar2 & 0xffffffff00000000);
            assertion_equal_string
                      (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                       (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                       (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                       (char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                       in_stack_fffffffffffffff0,(wchar_t)_v2);
            archive_entry_size_is_set(in_stack_fffffffffffffff0);
            assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                (char *)in_stack_ffffffffffffffb0,0,(char *)0x18187d,
                                in_stack_ffffffffffffffe0);
            archive_entry_size(in_stack_fffffffffffffff0);
            assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                (char *)in_stack_ffffffffffffffb0,0,(char *)0x1818b5,
                                in_stack_ffffffffffffffe0);
            archive_entry_mtime(in_stack_fffffffffffffff0);
            assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                (char *)in_stack_ffffffffffffffb0,0,(char *)0x1818f0,
                                in_stack_ffffffffffffffe0);
            archive_entry_atime(in_stack_fffffffffffffff0);
            paVar3 = (archive_entry_conflict *)0x0;
            assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                (char *)in_stack_ffffffffffffffb0,0,(char *)0x18192b,
                                in_stack_ffffffffffffffe0);
            archive_entry_stat(paVar3);
            assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                (char *)in_stack_ffffffffffffffb0,0,(char *)0x181967,
                                in_stack_ffffffffffffffe0);
            archive_entry_uid(in_stack_fffffffffffffff0);
            assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                (char *)in_stack_ffffffffffffffb0,0,(char *)0x1819a2,
                                in_stack_ffffffffffffffe0);
            archive_entry_gid(in_stack_fffffffffffffff0);
            entry = (archive_entry **)0x0;
            assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                (char *)in_stack_ffffffffffffffb0,0,(char *)0x1819dd,
                                in_stack_ffffffffffffffe0);
          }
          else {
            pcVar2 = archive_entry_pathname(paVar5);
            iVar1 = strcmp("symlink",pcVar2);
            if (iVar1 == 0) {
              archive_entry_filetype(in_stack_fffffffffffffff0);
              paVar5 = (archive_entry *)0x0;
              assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                  (char *)in_stack_ffffffffffffffb0,0,(char *)0x181a41,
                                  in_stack_ffffffffffffffe0);
              archive_entry_symlink(paVar5);
              in_stack_ffffffffffffffb0 =
                   (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
              assertion_equal_string
                        (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                         (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                         (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                         (char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                         in_stack_fffffffffffffff0,(wchar_t)_v2);
              archive_entry_size(in_stack_fffffffffffffff0);
              assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                  (char *)in_stack_ffffffffffffffb0,0,(char *)0x181ac0,
                                  in_stack_ffffffffffffffe0);
              archive_entry_mtime(in_stack_fffffffffffffff0);
              assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                  (char *)in_stack_ffffffffffffffb0,0,(char *)0x181afb,
                                  in_stack_ffffffffffffffe0);
              archive_entry_atime(in_stack_fffffffffffffff0);
              paVar3 = (archive_entry_conflict *)0x0;
              assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                  (char *)in_stack_ffffffffffffffb0,0,(char *)0x181b36,
                                  in_stack_ffffffffffffffe0);
              archive_entry_stat(paVar3);
              assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                  (char *)in_stack_ffffffffffffffb0,0,(char *)0x181b72,
                                  in_stack_ffffffffffffffe0);
              archive_entry_uid(in_stack_fffffffffffffff0);
              assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                  (char *)in_stack_ffffffffffffffb0,0,(char *)0x181bad,
                                  in_stack_ffffffffffffffe0);
              archive_entry_gid(in_stack_fffffffffffffff0);
              entry = (archive_entry **)0x0;
              assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                  in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                  (char *)in_stack_ffffffffffffffb0,0,(char *)0x181be8,
                                  in_stack_ffffffffffffffe0);
            }
            else {
              pcVar2 = archive_entry_pathname(paVar5);
              iVar1 = strcmp("symlink2",pcVar2);
              if (iVar1 == 0) {
                archive_entry_filetype(in_stack_fffffffffffffff0);
                paVar5 = (archive_entry *)0x0;
                assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                    (char *)in_stack_ffffffffffffffb0,0,(char *)0x181c4c,
                                    in_stack_ffffffffffffffe0);
                archive_entry_symlink(paVar5);
                in_stack_ffffffffffffffb0 =
                     (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
                assertion_equal_string
                          (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                           (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                           (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                           (char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                           in_stack_fffffffffffffff0,(wchar_t)_v2);
                archive_entry_size(in_stack_fffffffffffffff0);
                paVar3 = (archive_entry_conflict *)0x0;
                assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                    (char *)in_stack_ffffffffffffffb0,0,(char *)0x181ccb,
                                    in_stack_ffffffffffffffe0);
                archive_entry_stat(paVar3);
                assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                    (char *)in_stack_ffffffffffffffb0,0,(char *)0x181d07,
                                    in_stack_ffffffffffffffe0);
                archive_entry_uid(in_stack_fffffffffffffff0);
                assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                    (char *)in_stack_ffffffffffffffb0,0,(char *)0x181d42,
                                    in_stack_ffffffffffffffe0);
                archive_entry_gid(in_stack_fffffffffffffff0);
                entry = (archive_entry **)0x0;
                assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                    in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                    (char *)in_stack_ffffffffffffffb0,0,(char *)0x181d7d,
                                    in_stack_ffffffffffffffe0);
              }
              else {
                pcVar2 = archive_entry_pathname(paVar5);
                iVar1 = strcmp("symlink3",pcVar2);
                if (iVar1 == 0) {
                  archive_entry_filetype(in_stack_fffffffffffffff0);
                  paVar5 = (archive_entry *)0x0;
                  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x181de1,
                                      in_stack_ffffffffffffffe0);
                  archive_entry_symlink(paVar5);
                  in_stack_ffffffffffffffb0 =
                       (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
                  assertion_equal_string
                            (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                             (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                             (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                             (char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                             in_stack_fffffffffffffff0,(wchar_t)_v2);
                  archive_entry_size(in_stack_fffffffffffffff0);
                  paVar3 = (archive_entry_conflict *)0x0;
                  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x181e60,
                                      in_stack_ffffffffffffffe0);
                  archive_entry_stat(paVar3);
                  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x181e9c,
                                      in_stack_ffffffffffffffe0);
                  archive_entry_uid(in_stack_fffffffffffffff0);
                  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x181ed7,
                                      in_stack_ffffffffffffffe0);
                  archive_entry_gid(in_stack_fffffffffffffff0);
                  entry = (archive_entry **)0x0;
                  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                      in_stack_ffffffffffffffc4,(longlong)in_stack_ffffffffffffffb8,
                                      (char *)in_stack_ffffffffffffffb0,0,(char *)0x181f12,
                                      in_stack_ffffffffffffffe0);
                }
                else {
                  pcVar2 = archive_entry_pathname(paVar5);
                  iVar1 = strcmp("symlink4",pcVar2);
                  if (iVar1 == 0) {
                    archive_entry_filetype(in_stack_fffffffffffffff0);
                    paVar5 = (archive_entry *)0x0;
                    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                        in_stack_ffffffffffffffc4,
                                        (longlong)in_stack_ffffffffffffffb8,
                                        (char *)in_stack_ffffffffffffffb0,0,(char *)0x181f76,
                                        in_stack_ffffffffffffffe0);
                    archive_entry_symlink(paVar5);
                    in_stack_ffffffffffffffb0 =
                         (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
                    assertion_equal_string
                              (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                               (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                               (char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0)
                               ,(char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                               in_stack_fffffffffffffff0,(wchar_t)_v2);
                    archive_entry_size(in_stack_fffffffffffffff0);
                    paVar3 = (archive_entry_conflict *)0x0;
                    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                        in_stack_ffffffffffffffc4,
                                        (longlong)in_stack_ffffffffffffffb8,
                                        (char *)in_stack_ffffffffffffffb0,0,(char *)0x181ff5,
                                        in_stack_ffffffffffffffe0);
                    archive_entry_stat(paVar3);
                    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                        in_stack_ffffffffffffffc4,
                                        (longlong)in_stack_ffffffffffffffb8,
                                        (char *)in_stack_ffffffffffffffb0,0,(char *)0x182031,
                                        in_stack_ffffffffffffffe0);
                    archive_entry_uid(in_stack_fffffffffffffff0);
                    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                        in_stack_ffffffffffffffc4,
                                        (longlong)in_stack_ffffffffffffffb8,
                                        (char *)in_stack_ffffffffffffffb0,0,(char *)0x18206c,
                                        in_stack_ffffffffffffffe0);
                    archive_entry_gid(in_stack_fffffffffffffff0);
                    entry = (archive_entry **)0x0;
                    assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                        in_stack_ffffffffffffffc4,
                                        (longlong)in_stack_ffffffffffffffb8,
                                        (char *)in_stack_ffffffffffffffb0,0,(char *)0x1820a7,
                                        in_stack_ffffffffffffffe0);
                  }
                  else {
                    pcVar2 = archive_entry_pathname(paVar5);
                    iVar1 = strcmp("symlink5",pcVar2);
                    if (iVar1 == 0) {
                      archive_entry_filetype(in_stack_fffffffffffffff0);
                      paVar5 = (archive_entry *)0x0;
                      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                          in_stack_ffffffffffffffc4,
                                          (longlong)in_stack_ffffffffffffffb8,
                                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x18210b,
                                          in_stack_ffffffffffffffe0);
                      archive_entry_symlink(paVar5);
                      in_stack_ffffffffffffffb0 =
                           (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
                      assertion_equal_string
                                (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                                 (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                 (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                  in_stack_ffffffffffffffc0),
                                 (char *)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0
                                 ,in_stack_fffffffffffffff0,(wchar_t)_v2);
                      archive_entry_size(in_stack_fffffffffffffff0);
                      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                          in_stack_ffffffffffffffc4,
                                          (longlong)in_stack_ffffffffffffffb8,
                                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x18218a,
                                          in_stack_ffffffffffffffe0);
                      archive_entry_mtime(in_stack_fffffffffffffff0);
                      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                          in_stack_ffffffffffffffc4,
                                          (longlong)in_stack_ffffffffffffffb8,
                                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x1821c5,
                                          in_stack_ffffffffffffffe0);
                      archive_entry_atime(in_stack_fffffffffffffff0);
                      paVar3 = (archive_entry_conflict *)0x0;
                      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                          in_stack_ffffffffffffffc4,
                                          (longlong)in_stack_ffffffffffffffb8,
                                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x182200,
                                          in_stack_ffffffffffffffe0);
                      archive_entry_stat(paVar3);
                      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                          in_stack_ffffffffffffffc4,
                                          (longlong)in_stack_ffffffffffffffb8,
                                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x18223c,
                                          in_stack_ffffffffffffffe0);
                      archive_entry_uid(in_stack_fffffffffffffff0);
                      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                          in_stack_ffffffffffffffc4,
                                          (longlong)in_stack_ffffffffffffffb8,
                                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x182277,
                                          in_stack_ffffffffffffffe0);
                      archive_entry_gid(in_stack_fffffffffffffff0);
                      entry = (archive_entry **)0x0;
                      assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                          in_stack_ffffffffffffffc4,
                                          (longlong)in_stack_ffffffffffffffb8,
                                          (char *)in_stack_ffffffffffffffb0,0,(char *)0x1822b2,
                                          in_stack_ffffffffffffffe0);
                    }
                    else {
                      pcVar2 = archive_entry_pathname(paVar5);
                      iVar1 = strcmp("symlink6",pcVar2);
                      if (iVar1 == 0) {
                        archive_entry_filetype(in_stack_fffffffffffffff0);
                        paVar5 = (archive_entry *)0x0;
                        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                            in_stack_ffffffffffffffc4,
                                            (longlong)in_stack_ffffffffffffffb8,
                                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x182316,
                                            in_stack_ffffffffffffffe0);
                        archive_entry_symlink(paVar5);
                        in_stack_ffffffffffffffb0 =
                             (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
                        assertion_equal_string
                                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                                   (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                   (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                   (char *)in_stack_ffffffffffffffb8,
                                   (char *)in_stack_ffffffffffffffb0,in_stack_fffffffffffffff0,
                                   (wchar_t)_v2);
                        archive_entry_size(in_stack_fffffffffffffff0);
                        paVar3 = (archive_entry_conflict *)0x0;
                        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                            in_stack_ffffffffffffffc4,
                                            (longlong)in_stack_ffffffffffffffb8,
                                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x182395,
                                            in_stack_ffffffffffffffe0);
                        archive_entry_stat(paVar3);
                        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                            in_stack_ffffffffffffffc4,
                                            (longlong)in_stack_ffffffffffffffb8,
                                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x1823d1,
                                            in_stack_ffffffffffffffe0);
                        archive_entry_uid(in_stack_fffffffffffffff0);
                        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                            in_stack_ffffffffffffffc4,
                                            (longlong)in_stack_ffffffffffffffb8,
                                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x18240c,
                                            in_stack_ffffffffffffffe0);
                        archive_entry_gid(in_stack_fffffffffffffff0);
                        entry = (archive_entry **)0x0;
                        assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                            in_stack_ffffffffffffffc4,
                                            (longlong)in_stack_ffffffffffffffb8,
                                            (char *)in_stack_ffffffffffffffb0,0,(char *)0x182447,
                                            in_stack_ffffffffffffffe0);
                      }
                      else {
                        failure("Saw a file that shouldn\'t have been there");
                        archive_entry_pathname(paVar5);
                        entry = (archive_entry **)0x0;
                        in_stack_ffffffffffffffb0 =
                             (archive *)((ulong)in_stack_ffffffffffffffb0 & 0xffffffff00000000);
                        assertion_equal_string
                                  (in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
                                   (char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),
                                   (char *)CONCAT44(in_stack_ffffffffffffffc4,
                                                    in_stack_ffffffffffffffc0),
                                   (char *)in_stack_ffffffffffffffb8,
                                   (char *)in_stack_ffffffffffffffb0,in_stack_fffffffffffffff0,
                                   (wchar_t)_v2);
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  archive_read_next_header(in_stack_ffffffffffffffb0,entry);
  iVar1 = 0;
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x182502,in_stack_ffffffffffffffe0);
  archive_filter_code(in_stack_ffffffffffffffb0,iVar1);
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x182540,in_stack_ffffffffffffffe0);
  archive_format((archive *)a_00);
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x18257c,in_stack_ffffffffffffffe0);
  archive_read_close((archive *)0x182586);
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,
                      (longlong)a_00,(char *)0x1825b5,in_stack_ffffffffffffffe0);
  archive_read_free((archive *)0x1825bf);
  assertion_equal_int((char *)CONCAT44(iVar6,in_stack_ffffffffffffffc8),in_stack_ffffffffffffffc4,
                      (longlong)in_stack_ffffffffffffffb8,(char *)in_stack_ffffffffffffffb0,0,
                      (char *)0x1825ed,in_stack_ffffffffffffffe0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_isorr_bz2)
{
	const char *refname = "test_read_format_iso_rockridge.iso.Z";
	struct archive_entry *ae;
	struct archive *a;
	const void *p;
	size_t size;
	int64_t offset;
	int i;

	extract_reference_file(refname);
	assert((a = archive_read_new()) != NULL);
	assertEqualInt(0, archive_read_support_filter_all(a));
	assertEqualInt(0, archive_read_support_format_all(a));
	assertEqualInt(ARCHIVE_OK,
	    archive_read_open_filename(a, refname, 10240));

	/* Retrieve each of the 8 files on the ISO image and
	 * verify that each one is what we expect. */
	for (i = 0; i < 10; ++i) {
		assertEqualInt(0, archive_read_next_header(a, &ae));
		
		assertEqualInt(archive_entry_is_encrypted(ae), 0);
		assertEqualIntA(a, archive_read_has_encrypted_entries(a), ARCHIVE_READ_FORMAT_ENCRYPTION_UNSUPPORTED);

		if (strcmp(".", archive_entry_pathname(ae)) == 0) {
			/* '.' root directory. */
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			/* Now, we read timestamp recorded by RRIP "TF". */ 
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(0, archive_entry_mtime_nsec(ae));
			/* Now, we read links recorded by RRIP "PX". */ 
			assertEqualInt(3, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualIntA(a, ARCHIVE_EOF,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt((int)size, 0);
		} else if (strcmp("dir", archive_entry_pathname(ae)) == 0) {
			/* A directory. */
			assertEqualString("dir", archive_entry_pathname(ae));
			assertEqualInt(AE_IFDIR, archive_entry_filetype(ae));
			assertEqualInt(2048, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("file", archive_entry_pathname(ae)) == 0) {
			/* A regular file. */
			assertEqualString("file", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualInt(12345684, archive_entry_size(ae));
			assertEqualInt(0,
			    archive_read_data_block(a, &p, &size, &offset));
			assertEqualInt(0, offset);
			assertEqualMem(p, "hello\n", 6);
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("hardlink", archive_entry_pathname(ae)) == 0) {
			/* A hardlink to the regular file. */
			/* Note: If "hardlink" gets returned before "file",
			 * then "hardlink" will get returned as a regular file
			 * and "file" will get returned as the hardlink.
			 * This test should tolerate that, since it's a
			 * perfectly permissible thing for libarchive to do. */
			assertEqualString("hardlink", archive_entry_pathname(ae));
			assertEqualInt(AE_IFREG, archive_entry_filetype(ae));
			assertEqualString("file", archive_entry_hardlink(ae));
			assertEqualInt(0, archive_entry_size_is_set(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(86401, archive_entry_mtime(ae));
			assertEqualInt(86401, archive_entry_atime(ae));
			assertEqualInt(2, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("file", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(172802, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink2", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp (an absolute path) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink3", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp/.. (with a ".." component) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp/..", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink4", archive_entry_pathname(ae)) == 0) {
			/* A symlink to a path with ".." and "." components */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(".././../tmp",
			    archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink5", archive_entry_pathname(ae)) == 0) {
			/* A symlink to the regular file with "/" components. */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString(".///file", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(172802, archive_entry_mtime(ae));
			assertEqualInt(172802, archive_entry_atime(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else if (strcmp("symlink6", archive_entry_pathname(ae)) == 0) {
			/* A symlink to /tmp//..
			 * (with "/" and ".." components) */
			assertEqualInt(AE_IFLNK, archive_entry_filetype(ae));
			assertEqualString("/tmp//..", archive_entry_symlink(ae));
			assertEqualInt(0, archive_entry_size(ae));
			assertEqualInt(1, archive_entry_stat(ae)->st_nlink);
			assertEqualInt(1, archive_entry_uid(ae));
			assertEqualInt(2, archive_entry_gid(ae));
		} else {
			failure("Saw a file that shouldn't have been there");
			assertEqualString(archive_entry_pathname(ae), "");
		}
	}

	/* End of archive. */
	assertEqualInt(ARCHIVE_EOF, archive_read_next_header(a, &ae));

	/* Verify archive format. */
	assertEqualInt(archive_filter_code(a, 0), ARCHIVE_FILTER_COMPRESS);
	assertEqualInt(archive_format(a), ARCHIVE_FORMAT_ISO9660_ROCKRIDGE);

	/* Close the archive. */
	assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}